

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int GetResponseDescriptorRPLIDAR
              (RPLIDAR *pRPLIDAR,int *pDataResponseLength,int *pSendMode,int *pDataType)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  size_t __n;
  uint uVar8;
  uint uVar9;
  long lVar10;
  char *__s;
  CHRONO chrono;
  uchar recvbuf [1024];
  timespec local_490;
  timespec local_480;
  undefined8 local_470;
  undefined8 uStack_468;
  long local_460;
  long lStack_458;
  timespec local_450;
  int local_440;
  char local_438 [1032];
  
  iVar3 = clock_getres(4,&local_450);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_480), iVar3 == 0)) {
    local_440 = 0;
    local_470 = 0;
    uStack_468 = 0;
    local_460 = 0;
    lStack_458 = 0;
  }
  uVar6 = 0;
  memset(local_438,0,0x400);
  iVar3 = (pRPLIDAR->RS232Port).DevType;
  if (iVar3 - 1U < 4) {
    iVar3 = (pRPLIDAR->RS232Port).s;
    do {
      sVar4 = recv(iVar3,local_438 + uVar6,(ulong)(7 - (int)uVar6),0);
      if ((int)sVar4 < 1) goto LAB_001aa529;
      uVar5 = (int)uVar6 + (int)sVar4;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < 7);
  }
  else {
    if (iVar3 != 0) {
LAB_001aa529:
      __s = "Error reading data from a RPLIDAR. ";
      iVar3 = 1;
      goto LAB_001aa5b3;
    }
    iVar3 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar6 = 0;
    do {
      sVar4 = read(iVar3,local_438 + uVar6,(ulong)(7 - (int)uVar6));
      if ((int)sVar4 < 1) goto LAB_001aa529;
      uVar5 = (int)uVar6 + (int)sVar4;
      uVar6 = (ulong)uVar5;
    } while (uVar5 < 7);
  }
  uVar5 = 7;
  do {
    uVar8 = 6;
    if ((int)uVar5 < 6) {
      uVar8 = uVar5;
    }
    uVar9 = 1;
    if (1 < (int)uVar5) {
      uVar9 = uVar5;
    }
    lVar7 = 0;
    do {
      *pDataResponseLength = 0;
      if (uVar5 - uVar8 == (int)lVar7) {
        uVar9 = uVar5 - uVar8;
        uVar8 = 7 - uVar8;
        goto LAB_001aa393;
      }
      if ((local_438[lVar7] == -0x5b) && (local_438[lVar7 + 1] == 'Z')) {
        bVar1 = local_438[lVar7 + 5];
        *pDataResponseLength =
             (bVar1 & 0x3f) << 0x18 | (uint)(byte)local_438[lVar7 + 4] << 0x10 |
             (uint)(byte)local_438[lVar7 + 3] << 8 | (uint)(byte)local_438[lVar7 + 2];
        *pSendMode = (uint)(bVar1 >> 6);
        *pDataType = (uint)(byte)local_438[lVar7 + 6];
        iVar3 = 0;
        if ((int)(uVar5 - (int)lVar7) < 8) {
          return 0;
        }
        __s = "Warning getting data from a RPLIDAR : Unexpected data after a response descriptor. ";
        goto LAB_001aa5b3;
      }
      puts("Warning : RPLIDAR bad start flag. ");
      lVar7 = lVar7 + 1;
    } while (uVar9 != (uint)lVar7);
    uVar8 = 7;
    if ((int)uVar9 < 7) {
      uVar8 = uVar9;
    }
LAB_001aa393:
    __n = (size_t)(int)(uVar5 - uVar9);
    memmove(local_438,local_438 + (int)uVar9,__n);
    uVar5 = (uVar5 - uVar9) + uVar8;
    if (0x3ff < (int)uVar5) {
      iVar3 = 4;
      __s = "Error reading data from a RPLIDAR : Invalid data. ";
      goto LAB_001aa5b3;
    }
    iVar2 = (pRPLIDAR->RS232Port).DevType;
    iVar3 = 1;
    if (iVar2 - 1U < 4) {
      iVar2 = (pRPLIDAR->RS232Port).s;
      uVar9 = 0;
      do {
        sVar4 = recv(iVar2,local_438 + uVar9 + __n,(long)(int)(uVar8 - uVar9),0);
        if ((int)sVar4 < 1) goto LAB_001aa534;
        uVar9 = uVar9 + (int)sVar4;
      } while ((int)uVar9 < (int)uVar8);
    }
    else {
      if (iVar2 != 0) {
LAB_001aa534:
        __s = "Error reading data from a RPLIDAR. ";
        goto LAB_001aa5b3;
      }
      iVar2 = *(int *)&(pRPLIDAR->RS232Port).hDev;
      uVar9 = 0;
      do {
        sVar4 = read(iVar2,local_438 + uVar9 + __n,(ulong)(uVar8 - uVar9));
        if ((int)sVar4 < 1) goto LAB_001aa534;
        uVar9 = uVar9 + (int)sVar4;
      } while (uVar9 < uVar8);
    }
    lVar10 = local_460;
    lVar7 = lStack_458;
    if (local_440 == 0) {
      clock_gettime(4,&local_490);
      lVar10 = ((local_490.tv_sec + local_460) - local_480.tv_sec) +
               (local_490.tv_nsec + lStack_458) / 1000000000;
      lVar7 = (local_490.tv_nsec + lStack_458) % 1000000000 - local_480.tv_nsec;
      if (lVar7 < 0) {
        lVar10 = lVar10 + ~((ulong)-lVar7 / 1000000000);
        lVar7 = lVar7 + 1000000000 + ((ulong)-lVar7 / 1000000000) * 1000000000;
      }
    }
    iVar3 = 2;
  } while ((double)lVar7 / 1000000000.0 + (double)lVar10 <= 4.0);
  __s = "Error reading data from a RPLIDAR : Response descriptor timeout. ";
LAB_001aa5b3:
  puts(__s);
  return iVar3;
}

Assistant:

inline int GetResponseDescriptorRPLIDAR(RPLIDAR* pRPLIDAR, int* pDataResponseLength, int* pSendMode, int* pDataType)
{
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired response descriptor...

	nbBytesToRequest = NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindResponseDescriptorRPLIDAR(recvbuf, BytesReceived, pDataResponseLength, pSendMode, pDataType, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Response descriptor timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a response descriptor. \n");
	}

	return EXIT_SUCCESS;
}